

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_new_std_file(JSContext *ctx,FILE *f,BOOL close_in_finalizer,BOOL is_popen)

{
  undefined8 *opaque;
  ulong uVar1;
  JSValue v;
  JSValue JVar2;
  
  v = JS_NewObjectClass(ctx,js_std_file_class_id);
  if ((int)v.tag != 6) {
    opaque = (undefined8 *)js_mallocz(ctx,0x10);
    if (opaque == (undefined8 *)0x0) {
      JS_FreeValue(ctx,v);
      v = (JSValue)(ZEXT816(6) << 0x40);
      uVar1 = 0;
      goto LAB_0010d827;
    }
    *(BOOL *)(opaque + 1) = close_in_finalizer;
    *(BOOL *)((long)opaque + 0xc) = is_popen;
    *opaque = f;
    JS_SetOpaque(v,opaque);
  }
  uVar1 = (ulong)v.u.ptr & 0xffffffff00000000;
LAB_0010d827:
  JVar2.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar1);
  JVar2.tag = v.tag;
  return JVar2;
}

Assistant:

static JSValue js_new_std_file(JSContext *ctx, FILE *f,
                               BOOL close_in_finalizer,
                               BOOL is_popen)
{
    JSSTDFile *s;
    JSValue obj;
    obj = JS_NewObjectClass(ctx, js_std_file_class_id);
    if (JS_IsException(obj))
        return obj;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->close_in_finalizer = close_in_finalizer;
    s->is_popen = is_popen;
    s->f = f;
    JS_SetOpaque(obj, s);
    return obj;
}